

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O1

void CVmBifTIO::set_script_file(uint argc)

{
  vm_val_t *filespec;
  script_stack_entry *psVar1;
  uint uVar2;
  vm_obj_id_t vVar3;
  int iVar4;
  vm_val_t *pvVar5;
  vm_rcdesc rc;
  vm_rcdesc local_70;
  
  CVmBif::check_argc_range(argc,1,2);
  if (sp_[-1].typ != VM_INT) {
    filespec = sp_ + -1;
    if (sp_[-1].typ == VM_NIL) {
      pvVar5 = sp_ + -2;
      sp_ = filespec;
      if (1 < argc) {
        sp_ = pvVar5;
      }
      uVar2 = CVmConsole::close_script_file(&G_console_X->super_CVmConsole);
      (*(G_console_X->super_CVmConsole)._vptr_CVmConsole[4])(G_console_X,(ulong)uVar2);
      CVmBif::retval_true();
      return;
    }
    vVar3 = 0;
    if (1 < argc) {
      if (sp_[-2].typ == VM_INT) {
        vVar3 = sp_[-2].val.obj;
      }
      else {
        vVar3 = vm_val_t::nonint_num_to_int(sp_ + -2);
      }
    }
    vm_rcdesc::init(&local_70,(EVP_PKEY_CTX *)"setScriptFile");
    iVar4 = CVmConsole::open_script_file
                      (&G_console_X->super_CVmConsole,filespec,&local_70,vVar3 & 1,
                       (uint)((vVar3 & 2) == 0));
    sp_ = sp_ + -(long)(int)argc;
    CVmBif::retval_bool((uint)(iVar4 == 0));
    return;
  }
  iVar4 = CVmBif::pop_int_val();
  if (1 < argc) {
    sp_ = sp_ + -1;
  }
  if (iVar4 == 0x7000) {
    psVar1 = (G_console_X->super_CVmConsole).script_sp_;
    if (psVar1 != (script_stack_entry *)0x0) {
      CVmBif::retval_int((ulong)(psVar1->quiet != 0) + (ulong)(psVar1->more_mode == 0) * 2 +
                         (ulong)(psVar1->event_script != 0) * 4);
      return;
    }
    CVmBif::retval_nil();
    return;
  }
  err_throw(0x902);
}

Assistant:

void CVmBifTIO::set_script_file(VMG_ uint argc)
{
    /* check arguments */
    check_argc_range(vmg_ argc, 1, 2);

    /* 
     *   If the filename is nil, close the current script file.  If the
     *   "filename" is a number, it's a special request.  Otherwise, the
     *   filename must be a string giving the name of the file to open. 
     */
    if (G_stk->get(0)->typ == VM_NIL)
    {
        /* discard the nil filename */
        G_stk->discard();
        
        /* pop the flags if present - they're superfluous in this case */
        if (argc >= 2)
            G_stk->discard();

        /* close the script file */
        close_script_file(vmg0_);

        /* this form always succeeds */
        retval_true(vmg0_);
    }
    else if (G_stk->get(0)->typ == VM_INT)
    {
        /* get the request code */
        int flags = pop_int_val(vmg0_);
        
        /* any additional argument is superfluous in this case */
        if (argc >= 2)
            G_stk->discard();

        /* check the request */
        switch (flags)
        {
        case VMBIFTADS_SCRIPTREQ_GET_STATUS:
            /* get the current script reading status */
            if (G_console->is_reading_script())
            {
                /* a script is in progress - return the script flags */
                retval_int(vmg_
                           (G_console->is_quiet_script()
                            ? VMBIFTADS_SCRIPT_QUIET : 0)
                           | (G_console->is_moremode_script()
                              ? 0 : VMBIFTADS_SCRIPT_NONSTOP)
                           | (G_console->is_event_script()
                              ? VMBIFTADS_SCRIPT_EVENT : 0));
            }
            else
            {
                /* not reading a script - return nil */
                retval_nil(vmg0_);
            }
            break;

        default:
            /* other flags are invalid */
            err_throw(VMERR_BAD_VAL_BIF);
        }
    }
    else
    {
        /* get the filename argument */
        const vm_val_t *filespec = G_stk->get(0);
    
        /* if they provided flags, get the flags */
        int flags = (argc >= 2 ? G_stk->get(1)->num_to_int(vmg0_) : 0);

        /* set up our recursive call descriptor */
        vm_rcdesc rc(vmg_ "setScriptFile", bif_table, 15,
                     G_stk->get(0), argc);

        /* open the script file */
        int ok = !G_console->open_script_file(
            vmg_ filespec, &rc,
            (flags & VMBIFTADS_SCRIPT_QUIET) != 0,
            !(flags & VMBIFTADS_SCRIPT_NONSTOP));

        /* discard arguments */
        G_stk->discard(argc);

        /* return true on success, nil on failure */
        retval_bool(vmg_ ok);
    }
}